

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<Fad<double>_>::Multiply
          (TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *A,TPZFMatrix<Fad<double>_> *B,
          int opt)

{
  ostream *poVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  long lVar2;
  long lVar3;
  Fad<double> local_68;
  Fad<double> local_48;
  
  lVar2 = (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if (opt == 0) {
    lVar3 = (this->super_TPZBaseMatrix).fRow;
    if (lVar2 != lVar3) goto LAB_00d2d424;
    lVar2 = (A->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
    if ((B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol == lVar2) goto LAB_00d2d431;
  }
  else {
    lVar3 = (this->super_TPZBaseMatrix).fCol;
    if (lVar2 == lVar3) {
      lVar2 = (A->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
      if ((B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol == lVar2) {
        if ((this->super_TPZBaseMatrix).fDecomposed != '\0') {
          std::operator<<((ostream *)&std::cerr,
                          "virtual void TPZMatrix<Fad<double>>::Multiply(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, int) const [T = Fad<double>]"
                         );
          poVar1 = std::operator<<((ostream *)&std::cerr,
                                   "\nERROR: Cannot multiply with opt when matrix is decomposed");
          std::operator<<(poVar1,"\nAborting...\n");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp"
                     ,0x6c8);
        }
        goto LAB_00d2d431;
      }
    }
    else {
LAB_00d2d424:
      lVar2 = (A->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
    }
  }
  (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (B,lVar3,lVar2);
LAB_00d2d431:
  switch((this->super_TPZBaseMatrix).fDecomposed) {
  case '\0':
    local_48.val_ = 1.0;
    local_48.dx_.num_elts = 0;
    local_68.val_ = 0.0;
    local_68.dx_.num_elts = 0;
    local_48.dx_.ptr_to_data = (double *)0x0;
    local_48.defaultVal = 0.0;
    local_68.dx_.ptr_to_data = (double *)0x0;
    local_68.defaultVal = 0.0;
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])
              (this,A,B,B,&local_48,&local_68,opt);
    Fad<double>::~Fad(&local_68);
    Fad<double>::~Fad(&local_48);
    return;
  case '\x01':
    TPZFMatrix<Fad<double>_>::operator=(B,A);
    UNRECOVERED_JUMPTABLE = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x43];
    break;
  default:
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZMatrix<Fad<double>>::Multiply(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, int) const [T = Fad<double>]"
                   );
    poVar1 = std::operator<<((ostream *)&std::cerr,"\nERROR: Cannot multiply with fDecomposed:");
    poVar1 = std::operator<<(poVar1,(this->super_TPZBaseMatrix).fDecomposed);
    std::operator<<(poVar1,"\nAborting...\n");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp"
               ,0x6e2);
  case '\x03':
    TPZFMatrix<Fad<double>_>::operator=(B,A);
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x44])(this,B);
    UNRECOVERED_JUMPTABLE = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x45];
    break;
  case '\x04':
    TPZFMatrix<Fad<double>_>::operator=(B,A);
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x46])(this,B);
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x48])(this,B);
    UNRECOVERED_JUMPTABLE = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x47];
  }
  (*UNRECOVERED_JUMPTABLE)(this,B);
  return;
}

Assistant:

void TPZMatrix<TVar>::Multiply(const TPZFMatrix<TVar> &A, TPZFMatrix<TVar>&B, int opt) const {
  
	
	if(!opt && (B.Rows() != Rows() || B.Cols() != A.Cols())) {
		B.Redim(Rows(),A.Cols());
	}
	else if (opt && (B.Rows() != Cols() || B.Cols() != A.Cols())) {
		B.Redim(Cols(),A.Cols());
	}else if(opt && this->fDecomposed){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Cannot multiply with opt when matrix is decomposed"
           <<"\nAborting...\n";
    DebugStop();
  }
  
  switch(this->fDecomposed){
  case ENoDecompose:
    MultAdd( A, B, B, 1.0, 0.0, opt);
    break;
  case ELU:
    B=A;
    Substitution(&B);
    break;
  case ECholesky:
    B=A;
    Subst_Forward(&B);
    Subst_Backward(&B);
    break;
  case ELDLt:
    B=A;
    Subst_LForward(&B);
    Subst_Diag(&B);
    Subst_LBackward(&B);
    break;
  default:
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Cannot multiply with fDecomposed:"<<fDecomposed
           <<"\nAborting...\n";
    DebugStop();
  }
	
}